

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

char * get_token_lexeme(VrplibParser *p)

{
  byte bVar1;
  char *__src;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  size_t __size;
  
  parser_eat_whitespaces(p);
  __src = p->at;
  sVar2 = p->size;
  pcVar4 = p->base;
  for (__size = 1; __src + __size + (-(long)pcVar4 - sVar2) != (char *)0x1; __size = __size + 1) {
    bVar1 = __src[__size - 1];
    if ((0x2e < (ulong)bVar1) || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(char)bVar1] & 8) == 0) break;
    }
    p->at = __src + __size;
  }
  if (__size == 1) {
    parser_eat_whitespaces(p);
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)malloc(__size);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
              ,0x1a0,"Failed memory allocation");
    }
    else {
      strncpy(pcVar4,__src,__size - 1);
      pcVar4[__size - 1] = '\0';
      parser_eat_whitespaces(p);
    }
  }
  return pcVar4;
}

Assistant:

static char *get_token_lexeme(VrplibParser *p) {
    parser_eat_whitespaces(p);
    char *at = p->at;

    while (!parser_is_eof(p) && (*p->at == '-' || *p->at == '+' ||
                                 *p->at == '.' || isalnum(*p->at))) {
        parser_adv(p, 1);
    }

    intptr_t toksize = p->at - at;

    if (toksize != 0) {
        char *lexeme = malloc(toksize + 1);
        if (!lexeme) {
            log_fatal("Failed memory allocation");
            return NULL;
        }

        strncpy(lexeme, at, toksize);
        lexeme[toksize] = '\0';
        parser_eat_whitespaces(p);
        return lexeme;
    }

    parser_eat_whitespaces(p);
    return NULL;
}